

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reader.cc
# Opt level: O2

index_t __thiscall xLearn::InmemReader::Samples(InmemReader *this,DMatrix **matrix)

{
  uint uVar1;
  uint uVar2;
  uint uVar3;
  uint uVar4;
  ulong uVar5;
  ulong uVar6;
  DMatrix *pDVar7;
  
  uVar1 = this->pos_;
  uVar5 = (ulong)uVar1;
  uVar2 = (this->data_buf_).row_length;
  uVar4 = this->num_samples_;
  uVar6 = 0;
  do {
    if (uVar4 == uVar6) {
LAB_001455e5:
      pDVar7 = &(this->super_Reader).data_samples_;
LAB_001455e9:
      *matrix = pDVar7;
      return uVar4;
    }
    if ((ulong)uVar2 <= uVar5 + uVar6) {
      if (uVar6 == 0) {
        if ((this->super_Reader).shuffle_ == true) {
          srand((this->super_Reader).seed_ + 1);
          std::
          random_shuffle<__gnu_cxx::__normal_iterator<unsigned_int*,std::vector<unsigned_int,std::allocator<unsigned_int>>>>
                    ((__normal_iterator<unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
                      )(this->order_).
                       super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                       super__Vector_impl_data._M_start,
                     (__normal_iterator<unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
                      )(this->order_).
                       super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                       super__Vector_impl_data._M_finish);
        }
        pDVar7 = (DMatrix *)0x0;
        uVar4 = 0;
        goto LAB_001455e9;
      }
      goto LAB_001455e5;
    }
    (this->super_Reader).data_samples_.row.
    super__Vector_base<std::vector<xLearn::Node,_std::allocator<xLearn::Node>_>_*,_std::allocator<std::vector<xLearn::Node,_std::allocator<xLearn::Node>_>_*>_>
    ._M_impl.super__Vector_impl_data._M_start[uVar6] =
         (this->data_buf_).row.
         super__Vector_base<std::vector<xLearn::Node,_std::allocator<xLearn::Node>_>_*,_std::allocator<std::vector<xLearn::Node,_std::allocator<xLearn::Node>_>_*>_>
         ._M_impl.super__Vector_impl_data._M_start
         [(this->order_).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
          super__Vector_impl_data._M_start[uVar5 + uVar6]];
    uVar3 = (this->order_).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
            super__Vector_impl_data._M_start[uVar5 + uVar6];
    (this->super_Reader).data_samples_.Y.super__Vector_base<float,_std::allocator<float>_>._M_impl.
    super__Vector_impl_data._M_start[uVar6] =
         (this->data_buf_).Y.super__Vector_base<float,_std::allocator<float>_>._M_impl.
         super__Vector_impl_data._M_start[uVar3];
    (this->super_Reader).data_samples_.norm.super__Vector_base<float,_std::allocator<float>_>.
    _M_impl.super__Vector_impl_data._M_start[uVar6] =
         (this->data_buf_).norm.super__Vector_base<float,_std::allocator<float>_>._M_impl.
         super__Vector_impl_data._M_start[uVar3];
    this->pos_ = uVar1 + 1 + (int)uVar6;
    uVar6 = uVar6 + 1;
  } while( true );
}

Assistant:

index_t InmemReader::Samples(DMatrix* &matrix) {
  for (int i = 0; i < num_samples_; ++i) {
    if (pos_ >= data_buf_.row_length) {
      // End of the data buffer
      if (i == 0) {
        if (shuffle_) {
          srand(this->seed_+1);
          random_shuffle(order_.begin(), order_.end());
        }
        matrix = nullptr;
        return 0;
      }
      break;
    }
    // Copy data between different DMatrix.
    data_samples_.row[i] = data_buf_.row[order_[pos_]];
    data_samples_.Y[i] = data_buf_.Y[order_[pos_]];
    data_samples_.norm[i] = data_buf_.norm[order_[pos_]];
    pos_++;
  }
  matrix = &data_samples_;
  return num_samples_;
}